

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O3

int GetExpectedTestCount(void)

{
  return 0x16;
}

Assistant:

int GetExpectedTestCount()
{
    int expected_test_count = 4;
#if IUTEST_HAS_PARAM_TEST
    expected_test_count += 6;
#endif
#if IUTEST_HAS_PARAM_METHOD_TEST
    expected_test_count += 6;
#endif
#if IUTEST_HAS_TYPED_TEST
    expected_test_count += 3;
#endif
#if IUTEST_HAS_TYPED_TEST_P
    expected_test_count += 3;
#endif
    return expected_test_count;
}